

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void OPN2_Reset(ym3438_t *chip,Bit32u rate,Bit32u clock)

{
  long lVar1;
  Bit32s BVar2;
  
  BVar2 = chip->rateratio;
  memset(chip,0,0x8560);
  for (lVar1 = -0x18; lVar1 != 0; lVar1 = lVar1 + 1) {
    (chip->eg_kon + lVar1 * 2)[0] = 0xff;
    (chip->eg_kon + lVar1 * 2)[1] = '\x03';
    chip->eg_out[lVar1] = 0x3ff;
    *(undefined1 *)((long)chip->eg_level + lVar1) = 3;
    chip->sl[lVar1] = '\x01';
  }
  for (lVar1 = -6; lVar1 != 0; lVar1 = lVar1 + 1) {
    chip->pan_r[lVar1] = '\x01';
    chip->ams[lVar1] = '\x01';
    chip->pan_volume_r[lVar1] = 0xb504;
    chip->pan_volume_r[lVar1 + 6] = 0xb504;
  }
  if (rate != 0) {
    BVar2 = (Bit32s)(((ulong)rate * 0x24000) / (ulong)clock);
  }
  chip->rateratio = BVar2;
  return;
}

Assistant:

void OPN2_Reset(ym3438_t *chip, Bit32u rate, Bit32u clock)
{
    Bit32u i, rateratio;
    rateratio = (Bit32u)chip->rateratio;
    memset(chip, 0, sizeof(ym3438_t));
    for (i = 0; i < 24; i++)
    {
        chip->eg_out[i] = 0x3ff;
        chip->eg_level[i] = 0x3ff;
        chip->eg_state[i] = eg_num_release;
        chip->multi[i] = 1;
    }
    for (i = 0; i < 6; i++)
    {
        chip->pan_l[i] = 1;
        chip->pan_r[i] = 1;
        chip->pan_volume_l[i] = 46340;
        chip->pan_volume_r[i] = 46340;
    }

    if (rate != 0)
    {
        chip->rateratio = (Bit32s)(Bit32u)((((Bit64u)144 * rate) << RSM_FRAC) / clock);
    }
    else
    {
        chip->rateratio = (Bit32s)rateratio;
    }
}